

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

void Llb_ManFlowUnmarkCone(Aig_Man_t *p,Vec_Ptr_t *vCone)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vCone_local;
  Aig_Man_t *p_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vCone);
    if (iVar1 <= local_24) {
      return;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(vCone,local_24);
    iVar1 = Aig_ObjIsNode(pObj_00);
    if (iVar1 == 0) break;
    if (((uint)(*(ulong *)&pObj_00->field_0x18 >> 5) & 1) != 1) {
      __assert_fail("pObj->fMarkB == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                    ,0x3eb,"void Llb_ManFlowUnmarkCone(Aig_Man_t *, Vec_Ptr_t *)");
    }
    *(ulong *)&pObj_00->field_0x18 = *(ulong *)&pObj_00->field_0x18 & 0xffffffffffffffdf;
    local_24 = local_24 + 1;
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                ,0x3ea,"void Llb_ManFlowUnmarkCone(Aig_Man_t *, Vec_Ptr_t *)");
}

Assistant:

void Llb_ManFlowUnmarkCone( Aig_Man_t * p, Vec_Ptr_t * vCone )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vCone, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        assert( pObj->fMarkB == 1 );
        pObj->fMarkB = 0;
    }
}